

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_clipboard.c
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  char *pcVar8;
  char *pcVar9;
  bool bVar10;
  bool bVar11;
  ALLEGRO_EVENT event;
  int local_78;
  int local_58;
  
  cVar1 = al_install_system(0x5020700,atexit);
  if (cVar1 == '\0') {
    pcVar8 = "Failed to init Allegro.\n";
  }
  else {
    cVar1 = al_init_image_addon();
    if (cVar1 == '\0') {
      pcVar8 = "Failed to init IIO addon.\n";
    }
    else {
      al_init_font_addon();
      lVar3 = al_create_display(0x280,0x1e0);
      if (lVar3 == 0) {
        pcVar8 = "Error creating display.\n";
      }
      else {
        cVar1 = al_install_keyboard();
        if (cVar1 == '\0') {
          pcVar8 = "Error installing keyboard.\n";
        }
        else {
          lVar4 = al_load_font("data/fixed_font.tga",0,0);
          if (lVar4 != 0) {
            uVar5 = al_create_timer(0x3fb999999999999a);
            uVar6 = al_create_event_queue();
            uVar7 = al_get_keyboard_event_source();
            al_register_event_source(uVar6,uVar7);
            uVar7 = al_get_timer_event_source(uVar5);
            al_register_event_source(uVar6,uVar7);
            uVar7 = al_get_display_event_source(lVar3);
            al_register_event_source(uVar6,uVar7);
            al_start_timer(uVar5);
            pcVar8 = (char *)0x0;
            al_set_blender(0,1,3);
            bVar11 = true;
            bVar10 = false;
            do {
              if (bVar11) {
                cVar1 = al_is_event_queue_empty(uVar6);
                if (cVar1 != '\0') {
                  if (pcVar8 != (char *)0x0) {
                    al_free_with_context
                              (pcVar8,0x43,
                               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/examples/ex_clipboard.c"
                               ,"main");
                  }
                  cVar1 = al_clipboard_has_text(lVar3);
                  if (cVar1 == '\0') {
                    pcVar8 = (char *)0x0;
                  }
                  else {
                    pcVar8 = (char *)al_get_clipboard_text(lVar3);
                  }
                  al_map_rgb_f(0,0,0);
                  al_clear_to_color();
                  if (pcVar8 == (char *)0x0) {
                    al_map_rgba_f();
                    pcVar9 = "No clipboard text available.";
                  }
                  else {
                    al_map_rgba_f();
                    pcVar9 = pcVar8;
                  }
                  bVar11 = false;
                  al_draw_text(lVar4,0,pcVar9);
                  al_flip_display();
                }
              }
              al_wait_for_event(uVar6);
              if (local_78 == 0x2a) {
LAB_00102623:
                bVar10 = true;
              }
              else if (local_78 == 0x1e) {
                bVar11 = true;
              }
              else if (local_78 == 10) {
                if (local_58 == 0x3b) goto LAB_00102623;
                if (local_58 == 0x4b) {
                  al_set_clipboard_text(lVar3);
                }
              }
              if (bVar10) {
                al_destroy_font(lVar4);
                return 0;
              }
            } while( true );
          }
          pcVar8 = "Error loading data/fixed_font.tga\n";
        }
      }
    }
  }
  abort_example(pcVar8);
  iVar2 = __cxa_atexit();
  return iVar2;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_TIMER *timer;
   ALLEGRO_EVENT_QUEUE *queue;
   ALLEGRO_FONT *font;
   char *text = NULL;
   bool done = false;
   bool redraw = true;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Failed to init Allegro.\n");
   }

   if (!al_init_image_addon()) {
      abort_example("Failed to init IIO addon.\n");
   }

   al_init_font_addon();
   init_platform_specific();

   display = al_create_display(640, 480);
   if (!display) {
      abort_example("Error creating display.\n");
   }

   if (!al_install_keyboard()) {
      abort_example("Error installing keyboard.\n");
   }

   font = al_load_font("data/fixed_font.tga", 0, 0);
   if (!font) {
      abort_example("Error loading data/fixed_font.tga\n");
   }

   timer = al_create_timer(INTERVAL);

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_keyboard_event_source());
   al_register_event_source(queue, al_get_timer_event_source(timer));
   al_register_event_source(queue, al_get_display_event_source(display));

   al_start_timer(timer);

   al_set_blender(ALLEGRO_ADD, ALLEGRO_ONE, ALLEGRO_INVERSE_ALPHA);

   while (!done) {
      ALLEGRO_EVENT event;

      if (redraw && al_is_event_queue_empty(queue)) {
         if (text)
            al_free(text);
         if (al_clipboard_has_text(display)) {
            text = al_get_clipboard_text(display);
         }
         else {
            text = NULL;
         }


         al_clear_to_color(al_map_rgb_f(0, 0, 0));

         if (text) {
            al_draw_text(font, al_map_rgba_f(1, 1, 1, 1.0), 0, 0, 0, text);
         }
         else {
            al_draw_text(font, al_map_rgba_f(1, 0, 0, 1.0), 0, 0, 0,
                         "No clipboard text available.");
         }
         al_flip_display();
         redraw = false;
      }

      al_wait_for_event(queue, &event);
      switch (event.type) {
         case ALLEGRO_EVENT_KEY_DOWN:
            if (event.keyboard.keycode == ALLEGRO_KEY_ESCAPE) {
               done = true;
            }
            else if (event.keyboard.keycode == ALLEGRO_KEY_SPACE) {
               al_set_clipboard_text(display, "Copied from Allegro!");
            }
            break;

         case ALLEGRO_EVENT_DISPLAY_CLOSE:
            done = true;
            break;

         case ALLEGRO_EVENT_TIMER:
            redraw = true;
            break;
      }
   }

   al_destroy_font(font);

   return 0;
}